

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *local_48;
  char *args [3];
  GLFWwindow *window;
  char *arg;
  int i;
  GLboolean child;
  char **argv_local;
  int argc_local;
  
  bVar1 = false;
  arg._0_4_ = 1;
  while( true ) {
    if (argc <= (int)arg) {
      pcVar3 = "parent";
      if (bVar1) {
        pcVar3 = "child";
      }
      fprintf(_stdout,"%s\n",pcVar3);
      fflush(_stdout);
      if (bVar1) {
        args[2] = (char *)0x0;
        glfwInit();
        glfwWindowHint(0x20004,0);
        args[2] = (char *)glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
        if ((GLFWwindow *)args[2] == (GLFWwindow *)0x0) {
          argv_local._4_4_ = 0x7d;
        }
        else {
          glfwMakeContextCurrent((GLFWwindow *)args[2]);
          glFlush();
          glfwDestroyWindow((GLFWwindow *)args[2]);
          glfwTerminate();
          argv_local._4_4_ = 0;
        }
      }
      else {
        local_48 = *argv;
        args[0] = "-child";
        args[1] = (char *)0x0;
        argv_local._4_4_ = execute(&local_48);
      }
      return argv_local._4_4_;
    }
    pcVar3 = argv[(int)arg];
    iVar2 = strcmp(pcVar3,"-child");
    if (iVar2 != 0) break;
    bVar1 = true;
    arg._0_4_ = (int)arg + 1;
  }
  fprintf(_stderr,"error: unknown arg %s\n",pcVar3);
  exit(1);
}

Assistant:

int
main(int argc, char **argv)
{
    GLboolean child = GL_FALSE;
    int i;

    for (i = 1; i < argc; ++i) {
        const char *arg = argv[i];
        if (strcmp(arg, "-child") == 0) {
            child = GL_TRUE;
        } else {
            fprintf(stderr, "error: unknown arg %s\n", arg);
            exit(1);
        }
    }

    fprintf(stdout, "%s\n", child ? "child" : "parent");
    fflush(stdout);

    if (child) {
        GLFWwindow* window = NULL;

        glfwInit();

        glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

        window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
        if (!window) {
             return EXIT_SKIP;
        }

        glfwMakeContextCurrent(window);

        glFlush();

        glfwDestroyWindow(window);
        glfwTerminate();

        return 0;
    } else {
        const char *args[3];

        args[0] = argv[0];
        args[1] = "-child";
        args[2] = NULL;
        return execute((char * const *)args);
    }
}